

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

uintmax_t ghc::filesystem::file_size(path *p)

{
  uint code;
  int iVar1;
  error_category *peVar2;
  uint *puVar3;
  filesystem_error *this;
  error_code ec;
  stat fileStat;
  stat sStack_b8;
  
  peVar2 = (error_category *)std::_V2::system_category();
  iVar1 = stat((p->_path)._M_dataplus._M_p,&sStack_b8);
  if (iVar1 == -1) {
    puVar3 = (uint *)__errno_location();
    code = *puVar3;
    sStack_b8.st_size = 0xffffffffffffffff;
    if (code != 0) {
      this = (filesystem_error *)__cxa_allocate_exception(0x90);
      detail::systemErrorText<int>((string *)&sStack_b8,code);
      ec._4_4_ = 0;
      ec._M_value = code;
      ec._M_cat = peVar2;
      filesystem_error::filesystem_error(this,(string *)&sStack_b8,p,ec);
      __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
  }
  return sStack_b8.st_size;
}

Assistant:

GHC_INLINE uintmax_t file_size(const path& p)
{
    std::error_code ec;
    auto result = file_size(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}